

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O1

int size<entityx::EntityManager::UnpackingView<Position>>(UnpackingView<Position> *t)

{
  int iVar1;
  Iterator __begin0;
  Iterator __end0;
  ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false> local_78;
  Unpacker *local_50;
  Iterator local_48;
  
  local_78.manager_ = t->manager_;
  local_78.mask_.super__Base_bitset<1UL>._M_w =
       (_Base_bitset<1UL>)(t->mask_).super__Base_bitset<1UL>._M_w;
  local_50 = &t->unpacker_;
  local_78.i_ = 0;
  local_78.capacity_ =
       *(long *)(local_78.manager_ + 0x50) - *(long *)(local_78.manager_ + 0x48) >> 3;
  local_78.free_cursor_ = 0xffffffffffffffff;
  entityx::EntityManager::
  ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>::next(&local_78);
  entityx::EntityManager::UnpackingView<Position>::end(&local_48,t);
  iVar1 = 0;
  if (local_78.i_ !=
      local_48.super_ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>.
      i_) {
    iVar1 = 0;
    do {
      iVar1 = iVar1 + 1;
      local_78.i_ = local_78.i_ + 1;
      entityx::EntityManager::
      ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>::next
                (&local_78);
    } while (local_78.i_ !=
             local_48.
             super_ViewIterator<entityx::EntityManager::UnpackingView<Position>::Iterator,_false>.i_
            );
  }
  return iVar1;
}

Assistant:

int size(const T &t) {
  int n = 0;
  for (auto i : t) {
    ++n;
    (void)i;  // Unused on purpose, suppress warning
  }
  return n;
}